

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O0

istream * operator>>(istream *is,vec4f *v)

{
  void *pvVar1;
  istream *piVar2;
  vec4f *v_local;
  istream *is_local;
  
  pvVar1 = (void *)std::istream::operator>>(is,(float *)v);
  pvVar1 = (void *)std::istream::operator>>(pvVar1,(float *)(v + 4));
  pvVar1 = (void *)std::istream::operator>>(pvVar1,(float *)(v + 8));
  piVar2 = (istream *)std::istream::operator>>(pvVar1,(float *)(v + 0xc));
  return piVar2;
}

Assistant:

std::istream& operator >> (std::istream& is, vec4f& v) {
	return is >> v.x >> v.y >> v.z >> v.w;
}